

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall xmrig::Client::Client(Client *this,int id,char *agent,IClientListener *listener)

{
  uintptr_t uVar1;
  void *pvVar2;
  Dns *in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  RecvBuf<16384UL> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  Client *ptr;
  BaseClient *in_stack_ffffffffffffffb0;
  undefined8 *local_38;
  IDnsListener *in_stack_ffffffffffffffd8;
  
  BaseClient::BaseClient
            (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (IClientListener *)in_stack_ffffffffffffffa0);
  IDnsListener::IDnsListener((IDnsListener *)(in_RDI + 0x4e));
  ILineListener::ILineListener((ILineListener *)(in_RDI + 0x4f));
  *in_RDI = &PTR__Client_002b7230;
  in_RDI[0x4e] = &PTR__Client_002b7320;
  in_RDI[0x4f] = &PTR__Client_002b7348;
  *(undefined1 *)(in_RDI + 0x50) = 0;
  local_38 = (undefined8 *)((long)in_RDI + 0x281);
  do {
    *(undefined1 *)local_38 = 0;
    local_38 = (undefined8 *)((long)local_38 + 1);
  } while (local_38 != in_RDI + 0x150);
  in_RDI[0x150] = in_RDX;
  RecvBuf<16384UL>::RecvBuf(in_stack_ffffffffffffffa0);
  std::bitset<3UL>::bitset((bitset<3UL> *)0x1bea52);
  ptr = (Client *)(in_RDI + 0x954);
  String::String((String *)ptr);
  in_RDI[0x956] = 0;
  in_RDI[0x957] = 0;
  in_RDI[0x958] = 0;
  in_RDI[0x959] = 0;
  in_RDI[0x95a] = 0;
  in_RDI[0x95b] = 0;
  in_RDI[0x95c] = 0;
  uVar1 = Storage<xmrig::Client>::add((Storage<xmrig::Client> *)in_stack_ffffffffffffffb0,ptr);
  in_RDI[0x95a] = uVar1;
  pvVar2 = operator_new(0x90);
  Dns::Dns(in_RCX,in_stack_ffffffffffffffd8);
  in_RDI[0x151] = pvVar2;
  return;
}

Assistant:

xmrig::Client::Client(int id, const char *agent, IClientListener *listener) :
    BaseClient(id, listener),
    m_agent(agent)
{
    m_key = m_storage.add(this);
    m_dns = new Dns(this);
}